

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

void __thiscall Gnuplot::~Gnuplot(Gnuplot *this)

{
  int iVar1;
  GnuplotException *this_00;
  allocator local_31;
  string local_30;
  Gnuplot *local_10;
  Gnuplot *this_local;
  
  local_10 = this;
  iVar1 = pclose((FILE *)this->gnucmd);
  if (iVar1 == -1) {
    this_00 = (GnuplotException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_30,"Problem closing communication to gnuplot",&local_31);
    GnuplotException::GnuplotException(this_00,&local_30);
    __cxa_throw(this_00,&GnuplotException::typeinfo,GnuplotException::~GnuplotException);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->tmpfile_list);
  std::__cxx11::string::~string((string *)&this->smooth);
  std::__cxx11::string::~string((string *)&this->pstyle);
  return;
}

Assistant:

Gnuplot::~Gnuplot() {
//  remove_tmpfiles();
// A stream opened by popen() should be closed by pclose()
// #if defined(WIN32) || defined(_WIN32) || defined(__WIN32__) || defined(__TOS_WIN__)
//  if (_pclose(gnucmd) == -1)
 #if defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
    if (pclose(gnucmd) == -1)
 #endif
    throw GnuplotException("Problem closing communication to gnuplot");
}